

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpVirtualDir_set_CloseCallback(VDCallback_Close callback)

{
  VDCallback_Close p_Var1;
  int local_14;
  int ret;
  VDCallback_Close callback_local;
  
  local_14 = 0;
  p_Var1 = callback;
  if (callback == (VDCallback_Close)0x0) {
    local_14 = -0x65;
    p_Var1 = virtualDirCallback.close;
  }
  virtualDirCallback.close = p_Var1;
  return local_14;
}

Assistant:

int UpnpVirtualDir_set_CloseCallback(VDCallback_Close callback)
{
	int ret = UPNP_E_SUCCESS;
	if (!callback) {
		ret = UPNP_E_INVALID_PARAM;
	} else {
		virtualDirCallback.close = callback;
	}

	return ret;
}